

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O1

void InstructionSet::x86::Primitive::
     movs<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)3,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,unsigned_short *eCX,unsigned_short *eSI,
               unsigned_short *eDI,Context *context)

{
  uint uVar1;
  short sVar2;
  type_conflict2 tVar3;
  uint uVar4;
  uint16_t *puVar5;
  
  if (*eCX == 0) {
    return;
  }
  tVar3 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)0>
                    (&context->memory,(Source)(instruction->source_data_dest_sib_ >> 10) & BH | ES,
                     *eSI);
  uVar1 = ((context->memory).segments_)->es_base_;
  uVar4 = uVar1 + *eDI & 0xfffff;
  if (*eDI == 0xffff) {
    (context->memory).write_back_address_[0] = uVar4;
    (context->memory).write_back_address_[1] = uVar1 & 0xfffff;
  }
  else {
    if (uVar4 != 0xfffff) {
      puVar5 = (uint16_t *)((context->memory).memory._M_elems + uVar4);
      goto LAB_003902b8;
    }
    (context->memory).write_back_address_[0] = 0xfffff;
    (context->memory).write_back_address_[1] = 0;
  }
  puVar5 = &(context->memory).write_back_value_;
LAB_003902b8:
  *puVar5 = tVar3;
  sVar2 = (short)(context->flags).direction_ * 2;
  *eSI = *eSI + sVar2;
  *eDI = *eDI + sVar2;
  *eCX = *eCX - 1;
  if (*eCX != 0) {
    (context->flow_controller).should_repeat_ = true;
  }
  return;
}

Assistant:

bool repetition_over(
	const AddressT &eCX
) {
	return repetition != Repetition::None && !eCX;
}